

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unidim-lipm-dcm-estimator.cpp
# Opt level: O2

void __thiscall
stateObservation::UnidimLipmDcmEstimator::setInputs
          (UnidimLipmDcmEstimator *this,double dcm,double zmp)

{
  Vector1 u;
  Vector1 y;
  void *local_30 [2];
  double local_20;
  double local_18;
  
  local_20 = this->previousZmp_;
  this->previousZmp_ = zmp;
  local_18 = dcm;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::Matrix<double,1,1,0,1,1>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_30,
             (DenseBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)&local_18);
  ZeroDelayObserver::pushMeasurement((ZeroDelayObserver *)&this->filter_,(MeasureVector *)local_30);
  free(local_30[0]);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::Matrix<double,1,1,0,1,1>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_30,
             (DenseBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)&local_20);
  ZeroDelayObserver::pushInput((ZeroDelayObserver *)&this->filter_,(InputVector *)local_30);
  free(local_30[0]);
  return;
}

Assistant:

void UnidimLipmDcmEstimator::setInputs(double dcm, double zmp)
{
  Vector1 u;
  Vector1 y;

  y(0) = dcm;

  /// The prediction of the state depends on the previous value of the ZMP
  u(0) = previousZmp_;
  previousZmp_ = zmp;

  filter_.pushMeasurement(y);
  filter_.pushInput(u);
}